

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O3

void plot(double n)

{
  undefined1 auVar1 [16];
  char cVar2;
  char cVar3;
  int __c;
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = n;
  auVar1 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar5._0_16_);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = auVar1._0_8_ * 100.0;
  auVar1 = vminsd_avx(ZEXT816(0x4050000000000000),auVar4);
  cVar2 = (char)(int)auVar1._0_8_ + '0';
  cVar3 = 'X';
  if (cVar2 < ':') {
    cVar3 = cVar2;
  }
  __c = 0x2e;
  if ((int)auVar1._0_8_ != 0) {
    __c = (int)cVar3;
  }
  putchar(__c);
  return;
}

Assistant:

void plot ( double n )
{
  double n2 = n * 1;

  if(n2 < 0) n2 = 0;

  n2 *= 100;

  if(n2 > 64) n2 = 64;

  int n3 = (int)n2;

  if(n3 == 0)
    printf(".");
  else
  {
    char x = '0' + char(n3);

    if(x > '9') x = 'X';

    printf("%c",x);
  }
}